

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_benchmark.c
# Opt level: O2

void benchmark_logical_operations(void)

{
  bool bVar1;
  __time_t _Var2;
  __syscall_slong_t _Var3;
  int iVar4;
  bitset_container_t *bitset;
  bitset_container_t *bitset_00;
  bitset_container_t *bitset_01;
  ulong uVar5;
  int x;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  timespec ts;
  
  puts("\nLogical operations (time units per single operation):");
  bitset = bitset_container_create();
  for (uVar6 = 0; uVar6 < 0x10000; uVar6 = uVar6 + 3) {
    bitset_container_set(bitset,(uint16_t)uVar6);
  }
  bitset_00 = bitset_container_create();
  for (uVar6 = 0; uVar6 < 0x10000; uVar6 = uVar6 + 5) {
    bitset_container_set(bitset_00,(uint16_t)uVar6);
  }
  bitset_01 = bitset_container_create();
  bVar1 = false;
  printf("%s: ","bitset_container_and_nocard(B1, B2, BO)");
  fflush((FILE *)0x0);
  iVar7 = 500;
  uVar8 = 0xffffffffffffffff;
  while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
    clock_gettime(3,(timespec *)&ts);
    _Var3 = ts.tv_nsec;
    _Var2 = ts.tv_sec;
    iVar4 = bitset_container_and_nocard(bitset,bitset_00,bitset_01);
    if (iVar4 != -1) {
      bVar1 = true;
    }
    clock_gettime(3,(timespec *)&ts);
    uVar5 = (ts.tv_sec - _Var2) * 1000000000 + (ts.tv_nsec - _Var3);
    if (uVar5 < uVar8) {
      uVar8 = uVar5;
    }
  }
  printf(" %.2f cycles per operation",(double)uVar8);
  if (bVar1) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar1 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_and(B1, B2, BO)");
  fflush((FILE *)0x0);
  iVar7 = 500;
  uVar8 = 0xffffffffffffffff;
  while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
    clock_gettime(3,(timespec *)&ts);
    _Var3 = ts.tv_nsec;
    _Var2 = ts.tv_sec;
    iVar4 = bitset_container_and(bitset,bitset_00,bitset_01);
    if (iVar4 != 0x1112) {
      bVar1 = true;
    }
    clock_gettime(3,(timespec *)&ts);
    uVar5 = (ts.tv_sec - _Var2) * 1000000000 + (ts.tv_nsec - _Var3);
    if (uVar5 < uVar8) {
      uVar8 = uVar5;
    }
  }
  printf(" %.2f cycles per operation",(double)uVar8);
  if (bVar1) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar1 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_and_justcard(B1, B2)");
  fflush((FILE *)0x0);
  iVar7 = 500;
  uVar8 = 0xffffffffffffffff;
  while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
    clock_gettime(3,(timespec *)&ts);
    _Var3 = ts.tv_nsec;
    _Var2 = ts.tv_sec;
    iVar4 = bitset_container_and_justcard(bitset,bitset_00);
    if (iVar4 != 0x1112) {
      bVar1 = true;
    }
    clock_gettime(3,(timespec *)&ts);
    uVar5 = (ts.tv_sec - _Var2) * 1000000000 + (ts.tv_nsec - _Var3);
    if (uVar5 < uVar8) {
      uVar8 = uVar5;
    }
  }
  printf(" %.2f cycles per operation",(double)uVar8);
  if (bVar1) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar1 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_compute_cardinality(BO)");
  fflush((FILE *)0x0);
  iVar7 = 500;
  uVar8 = 0xffffffffffffffff;
  while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
    clock_gettime(3,(timespec *)&ts);
    _Var3 = ts.tv_nsec;
    _Var2 = ts.tv_sec;
    iVar4 = bitset_container_compute_cardinality(bitset_01);
    if (iVar4 != 0x1112) {
      bVar1 = true;
    }
    clock_gettime(3,(timespec *)&ts);
    uVar5 = (ts.tv_sec - _Var2) * 1000000000 + (ts.tv_nsec - _Var3);
    if (uVar5 < uVar8) {
      uVar8 = uVar5;
    }
  }
  printf(" %.2f cycles per operation",(double)uVar8);
  if (bVar1) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar1 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_or_nocard(B1, B2, BO)");
  fflush((FILE *)0x0);
  iVar7 = 500;
  uVar8 = 0xffffffffffffffff;
  while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
    clock_gettime(3,(timespec *)&ts);
    _Var3 = ts.tv_nsec;
    _Var2 = ts.tv_sec;
    iVar4 = bitset_container_or_nocard(bitset,bitset_00,bitset_01);
    if (iVar4 != -1) {
      bVar1 = true;
    }
    clock_gettime(3,(timespec *)&ts);
    uVar5 = (ts.tv_sec - _Var2) * 1000000000 + (ts.tv_nsec - _Var3);
    if (uVar5 < uVar8) {
      uVar8 = uVar5;
    }
  }
  printf(" %.2f cycles per operation",(double)uVar8);
  if (bVar1) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar1 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_or(B1, B2, BO)");
  fflush((FILE *)0x0);
  iVar7 = 500;
  uVar8 = 0xffffffffffffffff;
  while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
    clock_gettime(3,(timespec *)&ts);
    _Var3 = ts.tv_nsec;
    _Var2 = ts.tv_sec;
    iVar4 = bitset_container_or(bitset,bitset_00,bitset_01);
    if (iVar4 != 0x7778) {
      bVar1 = true;
    }
    clock_gettime(3,(timespec *)&ts);
    uVar5 = (ts.tv_sec - _Var2) * 1000000000 + (ts.tv_nsec - _Var3);
    if (uVar5 < uVar8) {
      uVar8 = uVar5;
    }
  }
  printf(" %.2f cycles per operation",(double)uVar8);
  if (bVar1) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar1 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_or_justcard(B1, B2)");
  fflush((FILE *)0x0);
  iVar7 = 500;
  uVar8 = 0xffffffffffffffff;
  while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
    clock_gettime(3,(timespec *)&ts);
    _Var3 = ts.tv_nsec;
    _Var2 = ts.tv_sec;
    iVar4 = bitset_container_or_justcard(bitset,bitset_00);
    if (iVar4 != 0x7778) {
      bVar1 = true;
    }
    clock_gettime(3,(timespec *)&ts);
    uVar5 = (ts.tv_sec - _Var2) * 1000000000 + (ts.tv_nsec - _Var3);
    if (uVar5 < uVar8) {
      uVar8 = uVar5;
    }
  }
  printf(" %.2f cycles per operation",(double)uVar8);
  if (bVar1) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar1 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_compute_cardinality(BO)");
  fflush((FILE *)0x0);
  iVar7 = 500;
  uVar8 = 0xffffffffffffffff;
  while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
    clock_gettime(3,(timespec *)&ts);
    _Var3 = ts.tv_nsec;
    _Var2 = ts.tv_sec;
    iVar4 = bitset_container_compute_cardinality(bitset_01);
    if (iVar4 != 0x7778) {
      bVar1 = true;
    }
    clock_gettime(3,(timespec *)&ts);
    uVar5 = (ts.tv_sec - _Var2) * 1000000000 + (ts.tv_nsec - _Var3);
    if (uVar5 < uVar8) {
      uVar8 = uVar5;
    }
  }
  printf(" %.2f cycles per operation",(double)uVar8);
  if (bVar1) {
    printf(" [ERROR]");
  }
  putchar(10);
  fflush((FILE *)0x0);
  bitset_container_free(bitset_01);
  bitset_container_free(bitset);
  bitset_container_free(bitset_00);
  putchar(10);
  return;
}

Assistant:

void benchmark_logical_operations() {
    printf("\nLogical operations (time units per single operation):\n");
    bitset_container_t* B1 = bitset_container_create();
    for (int x = 0; x < 1 << 16; x += 3) {
        bitset_container_set(B1, (uint16_t)x);
    }
    bitset_container_t* B2 = bitset_container_create();
    for (int x = 0; x < 1 << 16; x += 5) {
        bitset_container_set(B2, (uint16_t)x);
    }

    bitset_container_t* BO = bitset_container_create();

    const int and_cardinality = DIV_CEIL_64K(3 * 5);
    BEST_TIME(bitset_container_and_nocard(B1, B2, BO),
              BITSET_UNKNOWN_CARDINALITY, repeat, 1);
    BEST_TIME(bitset_container_and(B1, B2, BO), and_cardinality, repeat, 1);
    BEST_TIME(bitset_container_and_justcard(B1, B2), and_cardinality, repeat,
              1);
    BEST_TIME(bitset_container_compute_cardinality(BO), and_cardinality, repeat,
              1);

    const int or_cardinality =
        DIV_CEIL_64K(3) + DIV_CEIL_64K(5) - DIV_CEIL_64K(3 * 5);
    BEST_TIME(bitset_container_or_nocard(B1, B2, BO),
              BITSET_UNKNOWN_CARDINALITY, repeat, 1);
    BEST_TIME(bitset_container_or(B1, B2, BO), or_cardinality, repeat, 1);
    BEST_TIME(bitset_container_or_justcard(B1, B2), or_cardinality, repeat, 1);
    BEST_TIME(bitset_container_compute_cardinality(BO), or_cardinality, repeat,
              1);

    bitset_container_free(BO);
    bitset_container_free(B1);
    bitset_container_free(B2);
    printf("\n");
}